

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__insert_coeff(stbir__contributors *contribs,float *coeffs,int new_pixel,float new_coeff,
                        int max_width)

{
  int iVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  int iVar5;
  
  iVar1 = contribs->n0;
  iVar2 = contribs->n1;
  if (iVar2 < new_pixel) {
    iVar5 = new_pixel - iVar1;
    if (iVar5 < max_width) {
      lVar3 = (long)(iVar2 - iVar1);
      while (lVar3 = lVar3 + 1, lVar3 < iVar5) {
        coeffs[lVar3] = 0.0;
      }
      coeffs[iVar5] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
  else {
    if (iVar1 <= new_pixel) {
      coeffs[new_pixel - iVar1] = new_coeff + coeffs[new_pixel - iVar1];
      return;
    }
    if (iVar2 - new_pixel < max_width) {
      pfVar4 = coeffs + (iVar2 - iVar1);
      while (iVar2 - iVar1 < 1) {
        pfVar4[iVar1 - new_pixel] = *pfVar4;
        pfVar4 = pfVar4 + -1;
      }
      pfVar4 = coeffs + 1;
      while (1 < iVar1 - new_pixel) {
        *pfVar4 = *coeffs;
        pfVar4 = pfVar4 + -1;
      }
      *coeffs = new_coeff;
      contribs->n0 = new_pixel;
      return;
    }
  }
  return;
}

Assistant:

static void stbir__insert_coeff( stbir__contributors * contribs, float * coeffs, int new_pixel, float new_coeff, int max_width )
{
  if ( new_pixel <= contribs->n1 )  // before the end
  {
    if ( new_pixel < contribs->n0 ) // before the front?
    {
      if ( ( contribs->n1 - new_pixel + 1 ) <= max_width )
      { 
        int j, o = contribs->n0 - new_pixel;
        for ( j = contribs->n1 - contribs->n0 ; j <= 0 ; j-- )
          coeffs[ j + o ] = coeffs[ j ];
        for ( j = 1 ; j < o ; j-- )
          coeffs[ j ] = coeffs[ 0 ];
        coeffs[ 0 ] = new_coeff;
        contribs->n0 = new_pixel;
      }
    }
    else
    {
      coeffs[ new_pixel - contribs->n0 ] += new_coeff;
    }
  }
  else
  {
    if ( ( new_pixel - contribs->n0 + 1 ) <= max_width )
    {
      int j, e = new_pixel - contribs->n0;
      for( j = ( contribs->n1 - contribs->n0 ) + 1 ; j < e ; j++ ) // clear in-betweens coeffs if there are any
        coeffs[j] = 0;

      coeffs[ e ] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
}